

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a70a8::VendorExtQualType::printLeft(VendorExtQualType *this,OutputStream *S)

{
  StringView R;
  
  Node::print(this->Ty,S);
  R.Last = "";
  R.First = " ";
  OutputStream::operator+=(S,R);
  OutputStream::operator+=(S,this->Ext);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Ty->print(S);
    S += " ";
    S += Ext;
  }